

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  cmSystemToolsFileTime *t;
  allocator<char> local_661;
  undefined1 local_660 [8];
  string message;
  undefined1 local_620 [8];
  ostringstream e_2;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  bool local_451;
  undefined1 local_450 [7];
  bool changed;
  string emsg;
  bool have_ft;
  cmSystemToolsFileTime *ft;
  undefined1 local_418 [7];
  bool success;
  undefined1 local_3f8 [8];
  ostringstream e_1;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  undefined4 local_204;
  string local_200;
  undefined1 local_1e0 [8];
  ostringstream e;
  uint local_58;
  int local_54;
  uint i;
  Doing doing;
  char *newRPath;
  char *oldRPath;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  file.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&oldRPath);
  newRPath = (char *)0x0;
  _i = (char *)0x0;
  local_54 = 0;
  local_58 = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)file.field_2._8_8_);
    if (sVar2 <= local_58) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        if (newRPath == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"RPATH_CHANGE not given OLD_RPATH option.",&local_251);
          cmCommand::SetError(&this->super_cmCommand,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator(&local_251);
          this_local._7_1_ = false;
          local_204 = 1;
        }
        else if (_i == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"RPATH_CHANGE not given NEW_RPATH option.",&local_279);
          cmCommand::SetError(&this->super_cmCommand,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator(&local_279);
          this_local._7_1_ = false;
          local_204 = 1;
        }
        else {
          bVar1 = cmsys::SystemTools::FileExists((string *)&oldRPath,true);
          if (bVar1) {
            t = cmSystemTools::FileTimeNew();
            emsg.field_2._M_local_buf[0xf] = cmSystemTools::FileTimeGet((string *)&oldRPath,t);
            std::__cxx11::string::string((string *)local_450);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_478,newRPath,&local_479);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,_i,&local_4a1);
            bVar1 = cmSystemTools::ChangeRPath
                              ((string *)&oldRPath,&local_478,&local_4a0,(string *)local_450,
                               &local_451);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::allocator<char>::~allocator(&local_4a1);
            std::__cxx11::string::~string((string *)&local_478);
            std::allocator<char>::~allocator(&local_479);
            bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
              poVar4 = std::operator<<((ostream *)local_620,
                                       "RPATH_CHANGE could not write new RPATH:\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,_i);
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"to the file:\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,(string *)&oldRPath);
              poVar4 = std::operator<<(poVar4,"\n");
              std::operator<<(poVar4,(string *)local_450);
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)((long)&message.field_2 + 8));
              std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
            }
            ft._7_1_ = !bVar1;
            if (ft._7_1_) {
              if ((local_451 & 1U) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_660,"Set runtime path of \"",&local_661);
                std::allocator<char>::~allocator(&local_661);
                std::__cxx11::string::operator+=((string *)local_660,(string *)&oldRPath);
                std::__cxx11::string::operator+=((string *)local_660,"\" to \"");
                std::__cxx11::string::operator+=((string *)local_660,_i);
                std::__cxx11::string::operator+=((string *)local_660,"\"");
                cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,(string *)local_660,-1.0)
                ;
                std::__cxx11::string::~string((string *)local_660);
              }
              if ((emsg.field_2._M_local_buf[0xf] & 1U) != 0) {
                cmSystemTools::FileTimeSet((string *)&oldRPath,t);
              }
            }
            cmSystemTools::FileTimeDelete(t);
            this_local._7_1_ = ft._7_1_;
            local_204 = 1;
            std::__cxx11::string::~string((string *)local_450);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
            poVar4 = std::operator<<((ostream *)local_3f8,"RPATH_CHANGE given FILE \"");
            poVar4 = std::operator<<(poVar4,(string *)&oldRPath);
            std::operator<<(poVar4,"\" that does not exist.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_418);
            std::__cxx11::string::~string((string *)local_418);
            this_local._7_1_ = false;
            local_204 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"RPATH_CHANGE not given FILE option.",&local_229);
        cmCommand::SetError(&this->super_cmCommand,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator(&local_229);
        this_local._7_1_ = false;
        local_204 = 1;
      }
LAB_0032dd43:
      std::__cxx11::string::~string((string *)&oldRPath);
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)file.field_2._8_8_,(ulong)local_58);
    bVar1 = std::operator==(pvVar3,"OLD_RPATH");
    if (bVar1) {
      local_54 = 2;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)file.field_2._8_8_,(ulong)local_58);
      bVar1 = std::operator==(pvVar3,"NEW_RPATH");
      if (bVar1) {
        local_54 = 3;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)file.field_2._8_8_,(ulong)local_58);
        bVar1 = std::operator==(pvVar3,"FILE");
        if (bVar1) {
          local_54 = 1;
        }
        else {
          if (local_54 == 1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)file.field_2._8_8_,(ulong)local_58);
            std::__cxx11::string::operator=((string *)&oldRPath,(string *)pvVar3);
          }
          else if (local_54 == 2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)file.field_2._8_8_,(ulong)local_58);
            newRPath = (char *)std::__cxx11::string::c_str();
          }
          else {
            if (local_54 != 3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
              poVar4 = std::operator<<((ostream *)local_1e0,"RPATH_CHANGE given unknown argument ");
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)file.field_2._8_8_,(ulong)local_58);
              std::operator<<(poVar4,(string *)pvVar3);
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_200);
              std::__cxx11::string::~string((string *)&local_200);
              this_local._7_1_ = false;
              local_204 = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
              goto LAB_0032dd43;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)file.field_2._8_8_,(ulong)local_58);
            _i = (char *)std::__cxx11::string::c_str();
          }
          local_54 = 0;
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRPathChangeCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  const char* oldRPath = nullptr;
  const char* newRPath = nullptr;
  enum Doing
  {
    DoingNone,
    DoingFile,
    DoingOld,
    DoingNew
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "OLD_RPATH") {
      doing = DoingOld;
    } else if (args[i] == "NEW_RPATH") {
      doing = DoingNew;
    } else if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else if (doing == DoingOld) {
      oldRPath = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingNew) {
      newRPath = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
  }
  if (!oldRPath) {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
  }
  if (!newRPath) {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool changed;
  if (!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message, -1);
    }
    if (have_ft) {
      cmSystemTools::FileTimeSet(file, ft);
    }
  }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}